

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O1

void __thiscall
Disa::Vector_Dense<double,_0UL>::Vector_Dense
          (Vector_Dense<double,_0UL> *this,initializer_list<double> *list)

{
  size_type sVar1;
  iterator pdVar2;
  pointer pdVar3;
  long lVar4;
  initializer_list<double> *__range2;
  
  (this->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->super_vector<double,_std::allocator<double>_>).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->super_vector<double,_std::allocator<double>_>,list->_M_len);
  sVar1 = list->_M_len;
  if (sVar1 != 0) {
    pdVar2 = list->_M_array;
    pdVar3 = (this->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar4 = 0;
    do {
      *(undefined8 *)((long)pdVar3 + lVar4) = *(undefined8 *)((long)pdVar2 + lVar4);
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  return;
}

Assistant:

Vector_Dense(const std::initializer_list<_type>& list) {
    this->resize(list.size());
    auto iter = this->begin();
    FOR_EACH(item, list)* iter++ = item;
  }